

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

Offset<reflection::Type> __thiscall
flatbuffers::Type::Serialize(Type *this,FlatBufferBuilder *builder)

{
  uint16_t fixed_length;
  BaseType base_type;
  BaseType element;
  Offset<reflection::Type> OVar1;
  size_t sVar2;
  int local_48;
  int local_44;
  uint32_t local_28;
  size_t element_size;
  FlatBufferBuilder *builder_local;
  Type *this_local;
  
  sVar2 = SizeOf(this->element);
  local_28 = (uint32_t)sVar2;
  if (((this->base_type == BASE_TYPE_VECTOR) && (this->element == BASE_TYPE_STRUCT)) &&
     (this->struct_def->bytesize != 0)) {
    local_28 = (uint32_t)this->struct_def->bytesize;
  }
  base_type = this->base_type;
  element = this->element;
  if (this->struct_def == (StructDef *)0x0) {
    if (this->enum_def == (EnumDef *)0x0) {
      local_48 = -1;
    }
    else {
      local_48 = (this->enum_def->super_Definition).index;
    }
    local_44 = local_48;
  }
  else {
    local_44 = (this->struct_def->super_Definition).index;
  }
  fixed_length = this->fixed_length;
  sVar2 = SizeOf(this->base_type);
  OVar1 = reflection::CreateType
                    (builder,base_type,element,local_44,fixed_length,(uint32_t)sVar2,local_28);
  return (Offset<reflection::Type>)OVar1.o;
}

Assistant:

Offset<reflection::Type> Type::Serialize(FlatBufferBuilder *builder) const {
  size_t element_size = SizeOf(element);
  if (base_type == BASE_TYPE_VECTOR && element == BASE_TYPE_STRUCT &&
      struct_def->bytesize != 0) {
    // struct_def->bytesize==0 means struct is table
    element_size = struct_def->bytesize;
  }
  return reflection::CreateType(
      *builder, static_cast<reflection::BaseType>(base_type),
      static_cast<reflection::BaseType>(element),
      struct_def ? struct_def->index : (enum_def ? enum_def->index : -1),
      fixed_length, static_cast<uint32_t>(SizeOf(base_type)),
      static_cast<uint32_t>(element_size));
}